

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.c
# Opt level: O0

ZyanStatus
ZydisCalcAbsoluteAddressEx
          (ZydisDecodedInstruction *instruction,ZydisDecodedOperand *operand,ZyanU64 runtime_address
          ,ZydisRegisterContext *register_context,ZyanU64 *result_address)

{
  ZyanU8 ZVar1;
  ulong local_40;
  ZyanU64 value;
  ZyanU64 *result_address_local;
  ZydisRegisterContext *register_context_local;
  ZyanU64 runtime_address_local;
  ZydisDecodedOperand *operand_local;
  ZydisDecodedInstruction *instruction_local;
  
  if ((((instruction == (ZydisDecodedInstruction *)0x0) || (operand == (ZydisDecodedOperand *)0x0))
      || (register_context == (ZydisRegisterContext *)0x0)) || (result_address == (ZyanU64 *)0x0)) {
    instruction_local._4_4_ = 0x80100004;
  }
  else if ((operand->type == ZYDIS_OPERAND_TYPE_REGISTER) ||
          (((operand->type == ZYDIS_OPERAND_TYPE_MEMORY &&
            (((operand->field_10).mem.base != ZYDIS_REGISTER_NONE ||
             ((operand->field_10).mem.index != ZYDIS_REGISTER_NONE)))) &&
           (((operand->field_10).mem.base != ZYDIS_REGISTER_EIP &&
            ((operand->field_10).mem.base != ZYDIS_REGISTER_RIP)))))) {
    if (operand->type == ZYDIS_OPERAND_TYPE_REGISTER) {
      local_40 = register_context->values[(operand->field_10).mem.type];
    }
    else {
      if (operand->type != ZYDIS_OPERAND_TYPE_MEMORY) {
        return 0x80100004;
      }
      local_40 = (operand->field_10).mem.disp.value;
      if ((operand->field_10).mem.base != ZYDIS_REGISTER_NONE) {
        local_40 = register_context->values[(operand->field_10).mem.base] + local_40;
      }
      if ((operand->field_10).mem.index != ZYDIS_REGISTER_NONE) {
        local_40 = register_context->values[(operand->field_10).mem.index] *
                   (ulong)(operand->field_10).mem.scale + local_40;
      }
    }
    ZVar1 = instruction->address_width;
    if (ZVar1 == '\x10') {
      *result_address = local_40 & 0xffff;
      instruction_local._4_4_ = 0x100000;
    }
    else if (ZVar1 == ' ') {
      *result_address = local_40 & 0xffffffff;
      instruction_local._4_4_ = 0x100000;
    }
    else if (ZVar1 == '@') {
      *result_address = local_40;
      instruction_local._4_4_ = 0x100000;
    }
    else {
      instruction_local._4_4_ = 0x80100004;
    }
  }
  else {
    instruction_local._4_4_ =
         ZydisCalcAbsoluteAddress(instruction,operand,runtime_address,result_address);
  }
  return instruction_local._4_4_;
}

Assistant:

ZyanStatus ZydisCalcAbsoluteAddressEx(const ZydisDecodedInstruction* instruction,
    const ZydisDecodedOperand* operand, ZyanU64 runtime_address,
    const ZydisRegisterContext* register_context, ZyanU64* result_address)
{
    // TODO: Test this with AGEN/MIB operands
    // TODO: Add support for Gather/Scatter instructions

    if (!instruction || !operand || !register_context || !result_address)
    {
        return ZYAN_STATUS_INVALID_ARGUMENT;
    }

    if ((operand->type != ZYDIS_OPERAND_TYPE_REGISTER) &&
        ((operand->type != ZYDIS_OPERAND_TYPE_MEMORY) ||
        ((operand->mem.base == ZYDIS_REGISTER_NONE) &&
         (operand->mem.index == ZYDIS_REGISTER_NONE)) ||
        (operand->mem.base == ZYDIS_REGISTER_EIP) ||
        (operand->mem.base == ZYDIS_REGISTER_RIP)))
    {
        return ZydisCalcAbsoluteAddress(instruction, operand, runtime_address, result_address);
    }

    ZyanU64 value;
    if (operand->type == ZYDIS_OPERAND_TYPE_REGISTER)
    {
        value = register_context->values[operand->reg.value];
    }
    else if (operand->type == ZYDIS_OPERAND_TYPE_MEMORY)
    {
        value = operand->mem.disp.value;
        if (operand->mem.base)
        {
            value += register_context->values[operand->mem.base];
        }
        if (operand->mem.index)
        {
            value += register_context->values[operand->mem.index] * operand->mem.scale;
        }
    }
    else
    {
        return ZYAN_STATUS_INVALID_ARGUMENT;
    }

    switch (instruction->address_width)
    {
    case 16:
        *result_address = value & 0x000000000000FFFF;
        return ZYAN_STATUS_SUCCESS;
    case 32:
        *result_address = value & 0x00000000FFFFFFFF;
        return ZYAN_STATUS_SUCCESS;
    case 64:
        *result_address = value;
        return ZYAN_STATUS_SUCCESS;
    default:
        return ZYAN_STATUS_INVALID_ARGUMENT;
    }
}